

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

uchar * rsa_pkcs1_signature_string(size_t nbytes,ssh_hashalg *halg,ptrlen data)

{
  size_t sVar1;
  size_t __n;
  uchar *puVar2;
  ssh_hash *h_00;
  ptrlen pVar3;
  ssh_hash *h;
  uchar *bytes;
  ptrlen asn1_prefix;
  size_t padding;
  size_t fixed_parts;
  ssh_hashalg *halg_local;
  size_t nbytes_local;
  ptrlen data_local;
  
  sVar1 = rsa_pkcs1_length_of_fixed_parts(halg);
  if (sVar1 <= nbytes) {
    __n = nbytes - sVar1;
    pVar3 = rsa_pkcs1_prefix_for_hash(halg);
    puVar2 = (uchar *)safemalloc(nbytes,1,0);
    *puVar2 = '\0';
    puVar2[1] = '\x01';
    memset(puVar2 + 2,0xff,__n);
    bytes = (uchar *)pVar3.ptr;
    asn1_prefix.ptr = (void *)pVar3.len;
    memcpy(puVar2 + __n + 2,bytes,(size_t)asn1_prefix.ptr);
    h_00 = ssh_hash_new(halg);
    BinarySink_put_datapl(h_00->binarysink_,data);
    ssh_hash_final(h_00,puVar2 + __n + 2 + (long)asn1_prefix.ptr);
    return puVar2;
  }
  __assert_fail("nbytes >= fixed_parts",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c",
                0x2d7,
                "unsigned char *rsa_pkcs1_signature_string(size_t, const ssh_hashalg *, ptrlen)");
}

Assistant:

static unsigned char *rsa_pkcs1_signature_string(
    size_t nbytes, const ssh_hashalg *halg, ptrlen data)
{
    size_t fixed_parts = rsa_pkcs1_length_of_fixed_parts(halg);
    assert(nbytes >= fixed_parts);
    size_t padding = nbytes - fixed_parts;

    ptrlen asn1_prefix = rsa_pkcs1_prefix_for_hash(halg);

    unsigned char *bytes = snewn(nbytes, unsigned char);

    bytes[0] = 0;
    bytes[1] = 1;

    memset(bytes + 2, 0xFF, padding);

    memcpy(bytes + 2 + padding, asn1_prefix.ptr, asn1_prefix.len);

    ssh_hash *h = ssh_hash_new(halg);
    put_datapl(h, data);
    ssh_hash_final(h, bytes + 2 + padding + asn1_prefix.len);

    return bytes;
}